

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_helper.c
# Opt level: O0

uint arg_parse_uint_helper(arg *arg,char *err_msg)

{
  ulong uVar1;
  char *in_RSI;
  long in_RDI;
  unsigned_long rawval;
  char *endptr;
  char *local_20;
  char *local_18;
  long local_10;
  uint local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar1 = strtoul(*(char **)(in_RDI + 0x10),&local_20,10);
  if (local_18 != (char *)0x0) {
    *local_18 = '\0';
  }
  if ((**(char **)(local_10 + 0x10) == '\0') || (*local_20 != '\0')) {
    if (local_18 != (char *)0x0) {
      snprintf(local_18,200,"Option %s: Invalid character \'%c\'\n",*(undefined8 *)(local_10 + 8),
               (ulong)(uint)(int)*local_20);
    }
    local_4 = 0;
  }
  else if (uVar1 < 0x100000000) {
    local_4 = (uint)uVar1;
  }
  else {
    if (local_18 != (char *)0x0) {
      snprintf(local_18,200,"Option %s: Value %lu out of range for unsigned int\n",
               *(undefined8 *)(local_10 + 8),uVar1);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

unsigned int arg_parse_uint_helper(const struct arg *arg, char *err_msg) {
  char *endptr;
  const unsigned long rawval = strtoul(arg->val, &endptr, 10);  // NOLINT

  if (err_msg) err_msg[0] = '\0';

  if (arg->val[0] != '\0' && endptr[0] == '\0') {
    if (rawval <= UINT_MAX) return (unsigned int)rawval;
    SET_ERR_STRING("Option %s: Value %lu out of range for unsigned int\n",
                   arg->name, rawval);
    return 0;
  }
  SET_ERR_STRING("Option %s: Invalid character '%c'\n", arg->name, *endptr);
  return 0;
}